

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall Lodtalk::NativeError::NativeError(NativeError *this,string *errorMessage)

{
  string *errorMessage_local;
  NativeError *this_local;
  
  NativeException::NativeException(&this->super_NativeException);
  this->super_NativeException = (NativeException)&PTR__NativeError_0020d898;
  std::__cxx11::string::string((string *)&this->errorMessage,(string *)errorMessage);
  return;
}

Assistant:

virtual const char* what() const noexcept
	{
		return errorMessage.c_str();
	}